

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gls::BuiltinPrecisionTests::
InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
::operator()(InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
             *this,InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
                   *in1,
            InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *in2)

{
  float fVar1;
  bool bVar2;
  
  fVar1 = (in1->super_Tuple4<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>).a;
  bVar2 = true;
  if (((in2->super_Tuple4<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>).a <= fVar1)
     && (bVar2 = false,
        fVar1 <= (in2->super_Tuple4<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>).a)
     ) {
    fVar1 = (in1->super_Tuple4<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>).b;
    bVar2 = true;
    if (((in2->super_Tuple4<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>).b <= fVar1
        ) && ((bVar2 = false,
              fVar1 <= (in2->
                       super_Tuple4<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>).b
              && (bVar2 = true,
                 (in2->super_Tuple4<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>).c
                 <= (in1->super_Tuple4<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>)
                    .c)))) {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool operator() (const float& val1, const float& val2) const
	{
		if (deIsNaN(val1))
			return false;
		if (deIsNaN(val2))
			return true;
		return val1 < val2;
	}